

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction.cpp
# Opt level: O3

ErrorData * __thiscall
duckdb::DuckTransaction::Commit
          (ErrorData *__return_storage_ptr__,DuckTransaction *this,AttachedDatabase *db,
          transaction_t new_commit_id,
          unique_ptr<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>,_true>
          *commit_state)

{
  _Hash_node_base this_00;
  optional_ptr<duckdb::FileBuffer,_true> *poVar1;
  bool bVar2;
  __node_base *p_Var3;
  pointer this_01;
  pointer pSVar4;
  IteratorState iterator_state;
  IteratorState local_a0;
  TransactionException local_70;
  string local_60;
  string local_40;
  
  this->commit_id = new_commit_id;
  bVar2 = ChangesMade(this);
  if (bVar2) {
    p_Var3 = &(this->modified_tables)._M_h._M_before_begin;
    do {
      p_Var3 = p_Var3->_M_nxt;
      if (p_Var3 == (__node_base *)0x0) {
        BufferHandle::BufferHandle(&local_a0.handle);
        local_a0.current.ptr = (UndoBufferEntry *)0x0;
        this_01 = unique_ptr<duckdb::LocalStorage,_std::default_delete<duckdb::LocalStorage>,_true>
                  ::operator->(&this->storage);
        LocalStorage::Commit
                  (this_01,(optional_ptr<duckdb::StorageCommitState,_true>)
                           (commit_state->
                           super_unique_ptr<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>_>
                           )._M_t.
                           super___uniq_ptr_impl<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::StorageCommitState_*,_std::default_delete<duckdb::StorageCommitState>_>
                           .super__Head_base<0UL,_duckdb::StorageCommitState_*,_false>._M_head_impl)
        ;
        UndoBuffer::Commit(&this->undo_buffer,&local_a0,this->commit_id);
        if ((commit_state->
            super_unique_ptr<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::StorageCommitState_*,_std::default_delete<duckdb::StorageCommitState>_>
            .super__Head_base<0UL,_duckdb::StorageCommitState_*,_false>._M_head_impl !=
            (StorageCommitState *)0x0) {
          pSVar4 = unique_ptr<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>,_true>
                   ::operator->(commit_state);
          (*pSVar4->_vptr_StorageCommitState[3])(pSVar4);
        }
        ErrorData::ErrorData(__return_storage_ptr__);
        BufferHandle::~BufferHandle(&local_a0.handle);
        return __return_storage_ptr__;
      }
      this_00._M_nxt = p_Var3[1]._M_nxt;
    } while (((atomic<duckdb::DataTableVersion> *)(this_00._M_nxt + 0xf))->_M_i == MAIN_TABLE);
    poVar1 = &local_a0.handle.node;
    local_a0.handle.handle.internal.
    super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)poVar1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,
               "Attempting to modify table %s but another transaction has %s this table","");
    DataTable::GetTableName_abi_cxx11_(&local_40,(DataTable *)this_00._M_nxt);
    DataTable::TableModification_abi_cxx11_(&local_60,(DataTable *)this_00._M_nxt);
    TransactionException::TransactionException<std::__cxx11::string,std::__cxx11::string>
              (&local_70,(string *)&local_a0,&local_40,&local_60);
    ErrorData::ErrorData(__return_storage_ptr__,(exception *)&local_70);
    ::std::runtime_error::~runtime_error((runtime_error *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (local_a0.handle.handle.internal.
        super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)poVar1) {
      operator_delete(local_a0.handle.handle.internal.
                      super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  else {
    ErrorData::ErrorData(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

ErrorData DuckTransaction::Commit(AttachedDatabase &db, transaction_t new_commit_id,
                                  unique_ptr<StorageCommitState> commit_state) noexcept {
	// "checkpoint" parameter indicates if the caller will checkpoint. If checkpoint ==
	//    true: Then this function will NOT write to the WAL or flush/persist.
	//          This method only makes commit in memory, expecting caller to checkpoint/flush.
	//    false: Then this function WILL write to the WAL and Flush/Persist it.
	this->commit_id = new_commit_id;
	if (!ChangesMade()) {
		// no need to flush anything if we made no changes
		return ErrorData();
	}
	for (auto &entry : modified_tables) {
		auto &tbl = entry.first.get();
		if (!tbl.IsMainTable()) {
			return ErrorData(
			    TransactionException("Attempting to modify table %s but another transaction has %s this table",
			                         tbl.GetTableName(), tbl.TableModification()));
		}
	}
	D_ASSERT(db.IsSystem() || db.IsTemporary() || !IsReadOnly());

	UndoBuffer::IteratorState iterator_state;
	try {
		storage->Commit(commit_state.get());
		undo_buffer.Commit(iterator_state, commit_id);
		if (commit_state) {
			// if we have written to the WAL - flush after the commit has been successful
			commit_state->FlushCommit();
		}
		return ErrorData();
	} catch (std::exception &ex) {
		undo_buffer.RevertCommit(iterator_state, this->transaction_id);
		if (commit_state) {
			// if we have written to the WAL - truncate the WAL on failure
			commit_state->RevertCommit();
		}
		return ErrorData(ex);
	}
}